

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void nn_node_term(nn_trie_node *self)

{
  nn_trie_node **ppnVar1;
  uint local_1c;
  uint local_18;
  int i;
  int children;
  nn_trie_node *self_local;
  
  if (self != (nn_trie_node *)0x0) {
    if (self->type < 9) {
      local_1c = (uint)self->type;
    }
    else {
      local_1c = ((uint)(self->u).sparse.children[1] - (uint)(self->u).sparse.children[0]) + 1;
    }
    for (local_18 = 0; local_18 != local_1c; local_18 = local_18 + 1) {
      ppnVar1 = nn_node_child(self,local_18);
      nn_node_term(*ppnVar1);
    }
    nn_free(self);
  }
  return;
}

Assistant:

void nn_node_term (struct nn_trie_node *self)
{
    int children;
    int i;

    /*  Trivial case of the recursive algorithm. */
    if (!self)
        return;

    /*  Recursively destroy the child nodes. */
    children = self->type <= NN_TRIE_SPARSE_MAX ?
        self->type : (self->u.dense.max - self->u.dense.min + 1);
    for (i = 0; i != children; ++i)
        nn_node_term (*nn_node_child (self, i));

    /*  Deallocate this node. */
    nn_free (self);
}